

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall llbuild::core::TaskInterface::discoveredDependency(TaskInterface *this,KeyType *key)

{
  Task *task;
  KeyType *key_local;
  TaskInterface *this_local;
  
  anon_unknown.dwarf_12f2cc::BuildEngineImpl::taskDiscoveredDependency
            ((BuildEngineImpl *)this->impl,(Task *)this->ctx,key);
  return;
}

Assistant:

void TaskInterface::discoveredDependency(const KeyType& key) {
  Task* task = static_cast<Task*>(ctx);
  static_cast<BuildEngineImpl*>(impl)->taskDiscoveredDependency(task, key);
}